

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

AST * __thiscall jsonnet::internal::anon_unknown_0::Parser::parse(Parser *this,uint max_precedence)

{
  Identifier **ppIVar1;
  _List_node_base *p_Var2;
  Allocator *pAVar3;
  bool bVar4;
  __uniq_ptr_data<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>,_true,_true>
  _Var5;
  LiteralString *pLVar6;
  Identifier *pIVar7;
  AST *lhs;
  Function *pFVar8;
  StaticError *pSVar9;
  ostream *poVar10;
  pointer pBVar11;
  Token *pTVar12;
  bool trailing_comma;
  bool is_function;
  allocator<char> local_4c9;
  AST *msg;
  pointer pAStack_4c0;
  pointer local_4b8;
  uint local_4ac;
  AST *rest;
  pointer pFStack_4a0;
  pointer local_498;
  AST *cond;
  pointer pFStack_480;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_478;
  unique_ptr<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_> begin__1;
  Binds binds;
  Fodder fodder_r;
  Identifier *id;
  Token semicolon;
  LiteralString *lit;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  local_348 [5];
  LocationRange local_2d0;
  unique_ptr<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_> begin_;
  undefined1 local_288 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270 [3];
  LocationRange local_210 [4];
  Fodder colonFodder;
  LocationRange local_88;
  ArgParams local_48;
  
  _Var5.
  super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>.
  _M_t.
  super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
  .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl =
       (__uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>)
       operator_new(0xc0);
  Token::Token((Token *)_Var5.
                        super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                        .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl,
               (Token *)((this->tokens->
                         super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                         )._M_impl._M_node.super__List_node_base._M_next + 1));
  pFVar8 = (Function *)0x0;
  begin__1._M_t.
  super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>.
  _M_t.
  super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
  .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl =
       (__uniq_ptr_data<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>,_true,_true>
        )(__uniq_ptr_data<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>,_true,_true>
          )_Var5.
           super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>
           ._M_t.
           super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
           .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl;
  switch(*(undefined4 *)
          _Var5.
          super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>
          ._M_t.
          super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
          .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl) {
  case 0x12:
    pop((Token *)&begin_,this);
    Token::~Token((Token *)&begin_);
    cond = parse(this,0xf);
    colonFodder.
    super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    colonFodder.
    super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    colonFodder.
    super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    msg = (AST *)0x0;
    p_Var2 = (this->tokens->
             super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>).
             _M_impl._M_node.super__List_node_base._M_next;
    if ((*(int *)&p_Var2[1]._M_next == 0xc) &&
       (bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(p_Var2 + 3),":"), bVar4)) {
      pop(&semicolon,this);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      operator=(&colonFodder,&semicolon.fodder);
      msg = parse(this,0xf);
      Token::~Token(&semicolon);
    }
    popExpect(&semicolon,this,SEMICOLON,(char *)0x0);
    rest = parse(this,0xf);
    pAVar3 = this->alloc;
    span((LocationRange *)&lit,
         (Token *)_Var5.
                  super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                  .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl,rest);
    pFVar8 = (Function *)
             Allocator::
             make<jsonnet::internal::Assert,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&>
                       (pAVar3,(LocationRange *)&lit,
                        (Fodder *)
                        ((long)_Var5.
                               super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                               .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>.
                               _M_head_impl + 8),&cond,&colonFodder,&msg,&semicolon.fodder,&rest);
    std::__cxx11::string::~string((string *)&lit);
    Token::~Token(&semicolon);
    std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ::~vector(&colonFodder);
    break;
  case 0x14:
    pop((Token *)&begin_,this);
    Token::~Token((Token *)&begin_);
    lit = (LiteralString *)parse(this,0xf);
    pAVar3 = this->alloc;
    span((LocationRange *)&semicolon,
         (Token *)_Var5.
                  super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                  .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl,(AST *)lit)
    ;
    pFVar8 = (Function *)
             Allocator::
             make<jsonnet::internal::Error,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&>
                       (pAVar3,(LocationRange *)&semicolon,
                        (Fodder *)
                        ((long)_Var5.
                               super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                               .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>.
                               _M_head_impl + 8),(AST **)&lit);
    pTVar12 = &semicolon;
    goto LAB_001648fb;
  case 0x17:
    pop(&semicolon,this);
    Token::~Token(&semicolon);
    pop((Token *)&lit,this);
    if ((int)lit != 7) {
      std::__cxx11::stringstream::stringstream((stringstream *)&begin_);
      poVar10 = std::operator<<((ostream *)(local_288 + 8),"expected ( but got ");
      internal::operator<<(poVar10,(Token *)&lit);
      pSVar9 = (StaticError *)__cxa_allocate_exception(0x60);
      std::__cxx11::stringbuf::str();
      StaticError::StaticError(pSVar9,&local_2d0,(string *)&colonFodder);
      __cxa_throw(pSVar9,&StaticError::typeinfo,StaticError::~StaticError);
    }
    colonFodder.
    super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    colonFodder.
    super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    colonFodder.
    super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cond = (AST *)0x0;
    pFStack_480 = (pointer)0x0;
    local_478._M_allocated_capacity = 0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&begin_,"function parameter",(allocator<char> *)&rest);
    parseParams((ArgParams *)&msg,this,(string *)&begin_,(bool *)&fodder_r,(Fodder *)&cond);
    std::__cxx11::string::~string((string *)&begin_);
    rest = parse(this,0xf);
    pAVar3 = this->alloc;
    span((LocationRange *)&begin_,
         (Token *)_Var5.
                  super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                  .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl,rest);
    pFVar8 = Allocator::
             make<jsonnet::internal::Function,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::ArgParam,std::allocator<jsonnet::internal::ArgParam>>&,bool&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&>
                       (pAVar3,(LocationRange *)&begin_,
                        (Fodder *)
                        ((long)_Var5.
                               super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                               .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>.
                               _M_head_impl + 8),local_348,
                        (vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                         *)&msg,(bool *)&fodder_r,(Fodder *)&cond,&rest);
    std::__cxx11::string::~string((string *)&begin_);
    std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::~vector
              ((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *)
               &msg);
    std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               *)&cond);
    std::_Vector_base<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>::
    ~_Vector_base((_Vector_base<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>
                   *)&colonFodder);
    pTVar12 = (Token *)&lit;
    goto LAB_00164a20;
  case 0x18:
    pop((Token *)&begin_,this);
    Token::~Token((Token *)&begin_);
    cond = parse(this,0xf);
    popExpect(&semicolon,this,THEN,(char *)0x0);
    msg = parse(this,0xf);
    if (*(int *)&(this->tokens->
                 super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                 )._M_impl._M_node.super__List_node_base._M_next[1]._M_next == 0x13) {
      pop((Token *)&lit,this);
      rest = parse(this,0xf);
      pAVar3 = this->alloc;
      span((LocationRange *)&colonFodder,
           (Token *)_Var5.
                    super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                    .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl,rest);
      pFVar8 = (Function *)
               Allocator::
               make<jsonnet::internal::Conditional,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&>
                         (pAVar3,(LocationRange *)&colonFodder,
                          (Fodder *)
                          ((long)_Var5.
                                 super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                                 .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>.
                                 _M_head_impl + 8),&cond,&semicolon.fodder,&msg,local_348,&rest);
      std::__cxx11::string::~string((string *)&colonFodder);
      Token::~Token((Token *)&lit);
    }
    else {
      pAVar3 = this->alloc;
      span((LocationRange *)&lit,
           (Token *)_Var5.
                    super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                    .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl,msg);
      colonFodder.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      colonFodder.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      colonFodder.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      rest = (AST *)0x0;
      pFVar8 = (Function *)
               Allocator::
               make<jsonnet::internal::Conditional,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>,decltype(nullptr)>
                         (pAVar3,(LocationRange *)&lit,
                          (Fodder *)
                          ((long)_Var5.
                                 super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                                 .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>.
                                 _M_head_impl + 8),&cond,&semicolon.fodder,&msg,&colonFodder,&rest);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector(&colonFodder);
      std::__cxx11::string::~string((string *)&lit);
    }
    pTVar12 = &semicolon;
LAB_00164a20:
    Token::~Token(pTVar12);
    break;
  case 0x19:
    pop(&semicolon,this);
    Token::~Token(&semicolon);
    pLVar6 = (LiteralString *)parse(this,0xf);
    if ((pLVar6->super_AST).type != AST_LITERAL_STRING) {
      std::__cxx11::stringstream::stringstream((stringstream *)&begin_);
      std::operator<<((ostream *)(local_288 + 8),"computed imports are not allowed.");
      pSVar9 = (StaticError *)__cxa_allocate_exception(0x60);
      std::__cxx11::stringbuf::str();
      StaticError::StaticError(pSVar9,&(pLVar6->super_AST).location,(string *)&lit);
      __cxa_throw(pSVar9,&StaticError::typeinfo,StaticError::~StaticError);
    }
    lit = pLVar6;
    if (pLVar6->tokenKind == BLOCK) {
      pSVar9 = (StaticError *)__cxa_allocate_exception(0x60);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&begin_,"Cannot use text blocks in import statements.",
                 (allocator<char> *)&colonFodder);
      StaticError::StaticError(pSVar9,&(pLVar6->super_AST).location,(string *)&begin_);
      __cxa_throw(pSVar9,&StaticError::typeinfo,StaticError::~StaticError);
    }
    pAVar3 = this->alloc;
    span((LocationRange *)&begin_,
         (Token *)_Var5.
                  super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                  .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl,
         (AST *)pLVar6);
    pFVar8 = (Function *)
             Allocator::
             make<jsonnet::internal::Import,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::LiteralString*&>
                       (pAVar3,(LocationRange *)&begin_,
                        (Fodder *)
                        ((long)_Var5.
                               super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                               .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>.
                               _M_head_impl + 8),&lit);
    goto LAB_001648f0;
  case 0x1a:
    pop(&semicolon,this);
    Token::~Token(&semicolon);
    pLVar6 = (LiteralString *)parse(this,0xf);
    if ((pLVar6->super_AST).type != AST_LITERAL_STRING) {
      std::__cxx11::stringstream::stringstream((stringstream *)&begin_);
      std::operator<<((ostream *)(local_288 + 8),"computed imports are not allowed.");
      pSVar9 = (StaticError *)__cxa_allocate_exception(0x60);
      std::__cxx11::stringbuf::str();
      StaticError::StaticError(pSVar9,&(pLVar6->super_AST).location,(string *)&lit);
      __cxa_throw(pSVar9,&StaticError::typeinfo,StaticError::~StaticError);
    }
    lit = pLVar6;
    if (pLVar6->tokenKind == BLOCK) {
      pSVar9 = (StaticError *)__cxa_allocate_exception(0x60);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&begin_,"Cannot use text blocks in import statements.",
                 (allocator<char> *)&colonFodder);
      StaticError::StaticError(pSVar9,&(pLVar6->super_AST).location,(string *)&begin_);
      __cxa_throw(pSVar9,&StaticError::typeinfo,StaticError::~StaticError);
    }
    pAVar3 = this->alloc;
    span((LocationRange *)&begin_,
         (Token *)_Var5.
                  super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                  .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl,
         (AST *)pLVar6);
    pFVar8 = (Function *)
             Allocator::
             make<jsonnet::internal::Importstr,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::LiteralString*&>
                       (pAVar3,(LocationRange *)&begin_,
                        (Fodder *)
                        ((long)_Var5.
                               super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                               .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>.
                               _M_head_impl + 8),&lit);
    goto LAB_001648f0;
  case 0x1b:
    pop(&semicolon,this);
    Token::~Token(&semicolon);
    pLVar6 = (LiteralString *)parse(this,0xf);
    if ((pLVar6->super_AST).type != AST_LITERAL_STRING) {
      std::__cxx11::stringstream::stringstream((stringstream *)&begin_);
      std::operator<<((ostream *)(local_288 + 8),"computed imports are not allowed.");
      pSVar9 = (StaticError *)__cxa_allocate_exception(0x60);
      std::__cxx11::stringbuf::str();
      StaticError::StaticError(pSVar9,&(pLVar6->super_AST).location,(string *)&lit);
      __cxa_throw(pSVar9,&StaticError::typeinfo,StaticError::~StaticError);
    }
    lit = pLVar6;
    if (pLVar6->tokenKind == BLOCK) {
      pSVar9 = (StaticError *)__cxa_allocate_exception(0x60);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&begin_,"Cannot use text blocks in import statements.",
                 (allocator<char> *)&colonFodder);
      StaticError::StaticError(pSVar9,&(pLVar6->super_AST).location,(string *)&begin_);
      __cxa_throw(pSVar9,&StaticError::typeinfo,StaticError::~StaticError);
    }
    pAVar3 = this->alloc;
    span((LocationRange *)&begin_,
         (Token *)_Var5.
                  super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                  .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl,
         (AST *)pLVar6);
    pFVar8 = (Function *)
             Allocator::
             make<jsonnet::internal::Importbin,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::LiteralString*&>
                       (pAVar3,(LocationRange *)&begin_,
                        (Fodder *)
                        ((long)_Var5.
                               super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                               .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>.
                               _M_head_impl + 8),&lit);
LAB_001648f0:
    pTVar12 = (Token *)&begin_;
LAB_001648fb:
    std::__cxx11::string::~string((string *)pTVar12);
    break;
  case 0x1d:
    pop((Token *)&lit,this);
    local_4ac = max_precedence;
    Token::~Token((Token *)&lit);
    binds.
    super__Vector_base<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    binds.
    super__Vector_base<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    binds.
    super__Vector_base<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    while( true ) {
      popExpect((Token *)&begin_,this,IDENTIFIER,(char *)0x0);
      pAVar3 = this->alloc;
      Token::data32_abi_cxx11_((UString *)&semicolon,(Token *)&begin_);
      pIVar7 = Allocator::makeIdentifier(pAVar3,(UString *)&semicolon);
      std::__cxx11::u32string::~u32string((u32string *)&semicolon);
      pBVar11 = binds.
                super__Vector_base<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
                ._M_impl.super__Vector_impl_data._M_start;
      while (id = pIVar7,
            pBVar11 !=
            binds.
            super__Vector_base<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
        ppIVar1 = &pBVar11->var;
        pBVar11 = pBVar11 + 1;
        if (*ppIVar1 == pIVar7) {
          pSVar9 = (StaticError *)__cxa_allocate_exception(0x60);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &semicolon,"duplicate local var: ",local_270);
          StaticError::StaticError(pSVar9,local_210,(string *)&semicolon);
          __cxa_throw(pSVar9,&StaticError::typeinfo,StaticError::~StaticError);
        }
      }
      is_function = false;
      msg = (AST *)0x0;
      pAStack_4c0 = (pointer)0x0;
      local_4b8 = (pointer)0x0;
      trailing_comma = false;
      rest = (AST *)0x0;
      pFStack_4a0 = (pointer)0x0;
      local_498 = (pointer)0x0;
      fodder_r.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      fodder_r.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      fodder_r.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (*(int *)&(this->tokens->
                   super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                   )._M_impl._M_node.super__List_node_base._M_next[1]._M_next == 7) {
        pop(&semicolon,this);
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::operator=((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                     *)&rest,&semicolon.fodder);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&cond,"function parameter",&local_4c9);
        parseParams(&local_48,this,(string *)&cond,&trailing_comma,&fodder_r);
        std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
        _M_move_assign((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                        *)&msg,&local_48);
        std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
        ~vector(&local_48);
        std::__cxx11::string::~string((string *)&cond);
        is_function = true;
        Token::~Token(&semicolon);
      }
      popExpect(&semicolon,this,OPERATOR,"=");
      cond = parse(this,0xf);
      pop((Token *)&colonFodder,this);
      std::vector<jsonnet::internal::Local::Bind,std::allocator<jsonnet::internal::Local::Bind>>::
      emplace_back<std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::Identifier_const*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&,bool&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::ArgParam,std::allocator<jsonnet::internal::ArgParam>>&,bool&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&>
                ((vector<jsonnet::internal::Local::Bind,std::allocator<jsonnet::internal::Local::Bind>>
                  *)&binds,
                 (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  *)local_288,&id,&semicolon.fodder,&cond,&is_function,
                 (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  *)&rest,(vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                           *)&msg,&trailing_comma,&fodder_r,
                 (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  *)&colonFodder.
                     super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
      Token::~Token(&semicolon);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector(&fodder_r);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               *)&rest);
      std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
      ~vector((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *)
              &msg);
      Token::~Token((Token *)&begin_);
      if ((int)colonFodder.
               super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               ._M_impl.super__Vector_impl_data._M_start != 4) break;
      Token::~Token((Token *)&colonFodder);
    }
    if ((int)colonFodder.
             super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             ._M_impl.super__Vector_impl_data._M_start != 9) {
      std::__cxx11::stringstream::stringstream((stringstream *)&begin_);
      poVar10 = std::operator<<((ostream *)(local_288 + 8),"expected , or ; but got ");
      internal::operator<<(poVar10,(Token *)&colonFodder);
      pSVar9 = (StaticError *)__cxa_allocate_exception(0x60);
      std::__cxx11::stringbuf::str();
      StaticError::StaticError(pSVar9,&local_88,(string *)&semicolon);
      __cxa_throw(pSVar9,&StaticError::typeinfo,StaticError::~StaticError);
    }
    Token::~Token((Token *)&colonFodder);
    semicolon._0_8_ = parse(this,0xf);
    max_precedence = local_4ac;
    pAVar3 = this->alloc;
    span((LocationRange *)&begin_,
         (Token *)_Var5.
                  super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                  .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl,
         (AST *)semicolon._0_8_);
    pFVar8 = (Function *)
             Allocator::
             make<jsonnet::internal::Local,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::Local::Bind,std::allocator<jsonnet::internal::Local::Bind>>&,jsonnet::internal::AST*&>
                       (pAVar3,(LocationRange *)&begin_,
                        (Fodder *)
                        ((long)_Var5.
                               super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                               .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>.
                               _M_head_impl + 8),&binds,(AST **)&semicolon);
    std::__cxx11::string::~string((string *)&begin_);
    std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>::
    ~vector(&binds);
  }
  std::unique_ptr<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>::
  ~unique_ptr(&begin__1);
  if (pFVar8 == (Function *)0x0) {
    _Var5.
    super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>.
    _M_t.
    super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
    .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl =
         (__uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>)
         operator_new(0xc0);
    Token::Token((Token *)_Var5.
                          super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                          .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl,
                 (Token *)((this->tokens->
                           super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                           )._M_impl._M_node.super__List_node_base._M_next + 1));
    begin_._M_t.
    super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>.
    _M_t.
    super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
    .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl =
         (__uniq_ptr_data<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>,_true,_true>
          )(__uniq_ptr_data<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>,_true,_true>
            )_Var5.
             super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>
             ._M_t.
             super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
             .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>._M_head_impl;
    lhs = parseTerminalBracketsOrUnary(this);
    pFVar8 = (Function *)
             parseInfix(this,lhs,(Token *)_Var5.
                                          super___uniq_ptr_impl<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_jsonnet::internal::Token_*,_std::default_delete<jsonnet::internal::Token>_>
                                          .super__Head_base<0UL,_jsonnet::internal::Token_*,_false>.
                                          _M_head_impl,max_precedence);
    std::unique_ptr<jsonnet::internal::Token,_std::default_delete<jsonnet::internal::Token>_>::
    ~unique_ptr(&begin_);
  }
  return &pFVar8->super_AST;
}

Assistant:

AST *parse(unsigned max_precedence)
    {
        AST *ast = maybeParseGreedy();
        // There cannot be an operator after a greedy parse.
        if (ast != nullptr) return ast;

        // If we get here, we could be parsing an infix construct.

        // Allocate this on the heap to control stack growth.
        std::unique_ptr<Token> begin_(new Token(peek()));
        const Token &begin = *begin_;

        AST *lhs = parseTerminalBracketsOrUnary();

        return parseInfix(lhs, begin, max_precedence);
    }